

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

void __thiscall
ObjectTest_basic_array_access_operator_Test::~ObjectTest_basic_array_access_operator_Test
          (ObjectTest_basic_array_access_operator_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ObjectTest, basic_array_access_operator) {
	object obj;

	obj[0] = 1234;
	EXPECT_EQ(obj.size(), 1);
	EXPECT_EQ(obj[0].get<int>(), 1234);
	EXPECT_EQ(obj[1].get<int>(), 0);
	EXPECT_EQ(obj.size(), 2);

	obj[0] = 4567;
	EXPECT_EQ(obj[0].get<int>(), 4567);
	EXPECT_EQ(obj[1].get<int>(), 0);
	EXPECT_EQ(obj.size(), 2);

	obj[1] = 1234;
	EXPECT_EQ(obj[0].get<int>(), 4567);
	EXPECT_EQ(obj[1].get<int>(), 1234);
	EXPECT_EQ(obj.size(), 2);
}